

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssbase_type.cpp
# Opt level: O2

void DeleteNode(LinkList *pList,LinkListNode *pNode)

{
  int iVar1;
  LinkListNode *pLVar2;
  int iVar3;
  LinkListNode *pLVar4;
  
  iVar1 = pList->iNodeCount;
  if (iVar1 == 0) {
    return;
  }
  if (pList->pHead == pNode) {
    pList->pHead = pNode->pNext;
  }
  else {
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    iVar3 = iVar3 + 1;
    pLVar2 = pList->pHead;
    do {
      pLVar4 = pLVar2;
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) goto LAB_00105942;
      pLVar2 = pLVar4->pNext;
    } while (pLVar4->pNext != pNode);
    if (pList->pTail == pNode) {
      pLVar4->pNext = (LinkListNode *)0x0;
      pList->pTail = pLVar4;
    }
    else {
      pLVar4->pNext = pNode->pNext;
    }
  }
LAB_00105942:
  pList->iNodeCount = iVar1 + -1;
  free(pNode->pData);
  free(pNode);
  return;
}

Assistant:

void DeleteNode(LinkList* pList, LinkListNode* pNode)
{
	if (pList->iNodeCount == 0)
		return;

	if (pNode == pList->pHead)
	{
		pList->pHead = pNode->pNext;
	}
	else
	{
		LinkListNode* pThroughNode = pList->pHead;
		for (int i = 0; i < pList->iNodeCount; i++)
		{
			if (pThroughNode->pNext == pNode)
			{
				if (pList->pTail == pNode)
				{
					pThroughNode->pNext = NULL;
					pList->pTail = pThroughNode;
				}
				else
				{
					pThroughNode->pNext = pNode->pNext;
				}
				break;
			}
			pThroughNode = pThroughNode->pNext;
		}
	}

	pList->iNodeCount--;
	if (pNode->pData)
		free(pNode->pData);
	free(pNode);
}